

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ArraySliceBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  vector<duckdb::LogicalType,_true> *this_00;
  LogicalTypeId LVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  bool bVar4;
  reference pvVar5;
  pointer pEVar6;
  LogicalType *other;
  reference pvVar7;
  NotImplementedException *this_01;
  BinderException *this_02;
  idx_t i;
  size_type __n;
  bool end_is_empty;
  undefined7 uStack_7f;
  LogicalType child_type;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> local_58;
  bool begin_is_empty;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,0);
  pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar5);
  LVar1 = (pEVar6->return_type).id_;
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  if (LVar1 - 1 < 2) {
    LogicalType::LogicalType(&child_type,UNKNOWN);
    pvVar7 = vector<duckdb::LogicalType,_true>::get<true>
                       (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,0
                       );
    LogicalType::operator=(pvVar7,&child_type);
    LogicalType::~LogicalType(&child_type);
    LogicalType::LogicalType(&child_type,SQLNULL);
    LogicalType::operator=(&(bound_function->super_BaseScalarFunction).return_type,&child_type);
  }
  else {
    if (LVar1 - 0x19 < 2) {
      if ((long)*(pointer *)
                 ((long)&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                         super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                         super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                         ._M_impl.super__Vector_impl_data + 8) -
          (long)(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start == 0x60) {
        this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&child_type,
                   "Slice with steps has not been implemented for string types, you can consider rewriting your query as follows:\n SELECT array_to_string((str_split(string, \'\')[begin:end:step], \'\');"
                   ,(allocator *)&begin_is_empty);
        NotImplementedException::NotImplementedException(this_01,(string *)&child_type);
        __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      this_00 = &(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments;
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,0);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      bVar4 = LogicalType::IsJSONType(&pEVar6->return_type);
      if (bVar4) {
        LogicalType::LogicalType(&child_type,VARCHAR);
        pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(this_00,0);
        LogicalType::operator=(pvVar7,&child_type);
        LogicalType::~LogicalType(&child_type);
        LogicalType::LogicalType(&child_type,VARCHAR);
        LogicalType::operator=(&(bound_function->super_BaseScalarFunction).return_type,&child_type);
        LogicalType::~LogicalType(&child_type);
      }
      else {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(arguments,0);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar5);
        LogicalType::operator=
                  (&(bound_function->super_BaseScalarFunction).return_type,&pEVar6->return_type);
      }
      for (__n = 1; __n != 3; __n = __n + 1) {
        pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                 ::get<true>(arguments,__n);
        pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(pvVar5);
        if ((pEVar6->return_type).id_ != LIST) {
          LogicalType::LogicalType(&child_type,BIGINT);
          pvVar7 = vector<duckdb::LogicalType,_true>::get<true>(this_00,__n);
          LogicalType::operator=(pvVar7,&child_type);
          LogicalType::~LogicalType(&child_type);
        }
      }
      goto LAB_01e19808;
    }
    if (LVar1 == LIST) {
      pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(arguments,0);
      pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar5);
      LogicalType::operator=
                (&(bound_function->super_BaseScalarFunction).return_type,&pEVar6->return_type);
      goto LAB_01e19808;
    }
    if (LVar1 != ARRAY) {
      this_02 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&child_type,"ARRAY_SLICE can only operate on LISTs and VARCHARs",
                 (allocator *)&begin_is_empty);
      BinderException::BinderException(this_02,(string *)&child_type);
      __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    other = ArrayType::GetChildType(&pEVar6->return_type);
    LogicalType::LogicalType(&child_type,other);
    LogicalType::LIST((LogicalType *)&begin_is_empty,&child_type);
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    local_58.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)&end_is_empty,context,&local_58,(LogicalType *)&begin_is_empty
               ,false);
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    _Var3._M_head_impl = _end_is_empty;
    _end_is_empty = (Expression *)0x0;
    _Var2._M_head_impl =
         (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pvVar5->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (_Var2._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
    }
    if (_end_is_empty != (Expression *)0x0) {
      (**(code **)(*(_func_int **)_end_is_empty + 8))();
    }
    _end_is_empty = (Expression *)0x0;
    if (local_58.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
        .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
        (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
        0x0) {
      (**(code **)(*(long *)local_58.
                            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                            .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl + 8))()
      ;
    }
    local_58.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>)
         0x0;
    pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(arguments,0);
    pEVar6 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar5);
    LogicalType::operator=
              (&(bound_function->super_BaseScalarFunction).return_type,&pEVar6->return_type);
    LogicalType::~LogicalType((LogicalType *)&begin_is_empty);
  }
  LogicalType::~LogicalType(&child_type);
LAB_01e19808:
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,1);
  begin_is_empty = CheckIfParamIsEmpty(pvVar5);
  if (!begin_is_empty) {
    LogicalType::LogicalType(&child_type,BIGINT);
    pvVar7 = vector<duckdb::LogicalType,_true>::get<true>
                       (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,1
                       );
    LogicalType::operator=(pvVar7,&child_type);
    LogicalType::~LogicalType(&child_type);
  }
  pvVar5 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::get<true>(arguments,2);
  bVar4 = CheckIfParamIsEmpty(pvVar5);
  _end_is_empty = (Expression *)CONCAT71(uStack_7f,bVar4);
  if (!bVar4) {
    LogicalType::LogicalType(&child_type,BIGINT);
    pvVar7 = vector<duckdb::LogicalType,_true>::get<true>
                       (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments,2
                       );
    LogicalType::operator=(pvVar7,&child_type);
    LogicalType::~LogicalType(&child_type);
  }
  make_uniq<duckdb::ListSliceBindData,duckdb::LogicalType&,bool&,bool&>
            ((duckdb *)&child_type,&(bound_function->super_BaseScalarFunction).return_type,
             &begin_is_empty,&end_is_empty);
  (local_38._M_pi)->_vptr__Sp_counted_base = (_func_int **)child_type._0_8_;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         local_38._M_pi;
}

Assistant:

static unique_ptr<FunctionData> ArraySliceBind(ClientContext &context, ScalarFunction &bound_function,
                                               vector<unique_ptr<Expression>> &arguments) {
	D_ASSERT(arguments.size() == 3 || arguments.size() == 4);
	D_ASSERT(bound_function.arguments.size() == 3 || bound_function.arguments.size() == 4);

	switch (arguments[0]->return_type.id()) {
	case LogicalTypeId::ARRAY: {
		// Cast to list
		auto child_type = ArrayType::GetChildType(arguments[0]->return_type);
		auto target_type = LogicalType::LIST(child_type);
		arguments[0] = BoundCastExpression::AddCastToType(context, std::move(arguments[0]), target_type);
		bound_function.return_type = arguments[0]->return_type;
	} break;
	case LogicalTypeId::LIST:
		// The result is the same type
		bound_function.return_type = arguments[0]->return_type;
		break;
	case LogicalTypeId::BLOB:
	case LogicalTypeId::VARCHAR:
		// string slice returns a string
		if (bound_function.arguments.size() == 4) {
			throw NotImplementedException(
			    "Slice with steps has not been implemented for string types, you can consider rewriting your query as "
			    "follows:\n SELECT array_to_string((str_split(string, '')[begin:end:step], '');");
		}
		if (arguments[0]->return_type.IsJSONType()) {
			// This is needed to avoid producing invalid JSON
			bound_function.arguments[0] = LogicalType::VARCHAR;
			bound_function.return_type = LogicalType::VARCHAR;
		} else {
			bound_function.return_type = arguments[0]->return_type;
		}
		for (idx_t i = 1; i < 3; i++) {
			if (arguments[i]->return_type.id() != LogicalTypeId::LIST) {
				bound_function.arguments[i] = LogicalType::BIGINT;
			}
		}
		break;
	case LogicalTypeId::SQLNULL:
	case LogicalTypeId::UNKNOWN:
		bound_function.arguments[0] = LogicalTypeId::UNKNOWN;
		bound_function.return_type = LogicalType::SQLNULL;
		break;
	default:
		throw BinderException("ARRAY_SLICE can only operate on LISTs and VARCHARs");
	}

	bool begin_is_empty = CheckIfParamIsEmpty(arguments[1]);
	if (!begin_is_empty) {
		bound_function.arguments[1] = LogicalType::BIGINT;
	}
	bool end_is_empty = CheckIfParamIsEmpty(arguments[2]);
	if (!end_is_empty) {
		bound_function.arguments[2] = LogicalType::BIGINT;
	}

	return make_uniq<ListSliceBindData>(bound_function.return_type, begin_is_empty, end_is_empty);
}